

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue)

{
  undefined1 local_30 [8];
  fio_defer_task_s task;
  fio_task_queue_s *queue_local;
  
  task.arg2 = queue;
  fio_defer_pop_task((fio_defer_task_s *)local_30,queue);
  if (local_30 == (undefined1  [8])0x0) {
    queue_local._4_4_ = -1;
  }
  else {
    (*(code *)local_30)(task.func,task.arg1);
    queue_local._4_4_ = 0;
  }
  return queue_local._4_4_;
}

Assistant:

static inline int
fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue) {
  fio_defer_task_s task = fio_defer_pop_task(queue);
  if (!task.func)
    return -1;
  task.func(task.arg1, task.arg2);
  return 0;
}